

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayingState.cpp
# Opt level: O0

void PlayingState::CmdUnWield
               (string *input,shared_ptr<Connection> *connection,shared_ptr<GameData> *game_data)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  ostream *poVar2;
  element_type *peVar3;
  string *local_378;
  string local_340 [32];
  undefined1 local_320 [48];
  shared_ptr<Item> local_2f0;
  undefined1 local_2e0 [8];
  shared_ptr<Item> off;
  shared_ptr<Item> local_2b0;
  shared_ptr<Item> local_2a0;
  undefined1 local_290 [8];
  shared_ptr<Item> main;
  stringstream ss;
  ostream local_270 [376];
  string local_f8 [33];
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d7;
  undefined1 local_d6;
  allocator local_d5 [20];
  allocator local_c1;
  string *local_c0;
  string local_b8 [32];
  string local_98 [32];
  iterator local_78;
  size_type local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  Utils local_50 [8];
  string match;
  undefined1 local_30 [8];
  shared_ptr<Player> player;
  shared_ptr<GameData> *game_data_local;
  shared_ptr<Connection> *connection_local;
  string *input_local;
  
  player.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)game_data;
  std::__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)connection
            );
  Connection::GetPlayer((Connection *)local_30);
  local_d6 = 1;
  local_c0 = local_b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"main",&local_c1);
  local_c0 = local_98;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"off",local_d5);
  local_d6 = 0;
  local_78 = (iterator)local_b8;
  local_70 = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_d7);
  __l._M_len = local_70;
  __l._M_array = local_78;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_68,__l,&local_d7);
  std::__cxx11::string::string(local_f8,(string *)input);
  Utils::FindMatch(local_50,&local_68,(string *)local_f8);
  std::__cxx11::string::~string(local_f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_d7);
  local_378 = (string *)&local_78;
  do {
    local_378 = local_378 + -0x20;
    std::__cxx11::string::~string(local_378);
  } while (local_378 != local_b8);
  std::allocator<char>::~allocator((allocator<char> *)local_d5);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::__cxx11::stringstream::stringstream
            ((stringstream *)&main.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_50,"main");
  if (bVar1) {
    std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)local_30);
    Player::GetMainHand((Player *)local_290);
    bVar1 = std::operator!=((shared_ptr<Item> *)local_290,(nullptr_t)0x0);
    if (bVar1) {
      peVar3 = std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          local_30);
      std::shared_ptr<Item>::shared_ptr(&local_2a0,(nullptr_t)0x0);
      Player::SetMainHand(peVar3,&local_2a0);
      std::shared_ptr<Item>::~shared_ptr(&local_2a0);
      peVar3 = std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          local_30);
      std::shared_ptr<Item>::shared_ptr(&local_2b0,(shared_ptr<Item> *)local_290);
      ItemContainer::AddItem(&peVar3->super_ItemContainer,&local_2b0);
      std::shared_ptr<Item>::~shared_ptr(&local_2b0);
      poVar2 = std::operator<<(local_270,"Unwielded ");
      std::__shared_ptr_access<Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)local_290);
      Item::GetItemName_abi_cxx11_
                ((Item *)&off.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      poVar2 = std::operator<<(poVar2,(string *)
                                      &off.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>.
                                       _M_refcount);
      std::operator<<(poVar2,(string *)Format::NL_abi_cxx11_);
      std::__cxx11::string::~string
                ((string *)&off.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    else {
      poVar2 = std::operator<<(local_270,"Nothing to unwield");
      std::operator<<(poVar2,(string *)Format::NL_abi_cxx11_);
    }
    std::shared_ptr<Item>::~shared_ptr((shared_ptr<Item> *)local_290);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_50,"off");
    if (bVar1) {
      std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)local_30);
      Player::GetOffHand((Player *)local_2e0);
      bVar1 = std::operator!=((shared_ptr<Item> *)local_2e0,(nullptr_t)0x0);
      if (bVar1) {
        peVar3 = std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                            )local_30);
        std::shared_ptr<Item>::shared_ptr(&local_2f0,(nullptr_t)0x0);
        Player::SetOffHand(peVar3,&local_2f0);
        std::shared_ptr<Item>::~shared_ptr(&local_2f0);
        peVar3 = std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                            )local_30);
        std::shared_ptr<Item>::shared_ptr
                  ((shared_ptr<Item> *)(local_320 + 0x20),(shared_ptr<Item> *)local_2e0);
        ItemContainer::AddItem(&peVar3->super_ItemContainer,(shared_ptr<Item> *)(local_320 + 0x20));
        std::shared_ptr<Item>::~shared_ptr((shared_ptr<Item> *)(local_320 + 0x20));
        poVar2 = std::operator<<(local_270,"Unwielded ");
        std::__shared_ptr_access<Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)local_2e0)
        ;
        Item::GetItemName_abi_cxx11_((Item *)local_320);
        poVar2 = std::operator<<(poVar2,(string *)local_320);
        std::operator<<(poVar2,(string *)Format::NL_abi_cxx11_);
        std::__cxx11::string::~string((string *)local_320);
      }
      else {
        poVar2 = std::operator<<(local_270,"Nothing to unwield");
        std::operator<<(poVar2,(string *)Format::NL_abi_cxx11_);
      }
      std::shared_ptr<Item>::~shared_ptr((shared_ptr<Item> *)local_2e0);
    }
    else {
      poVar2 = std::operator<<(local_270,"Please indicate <main> or <off> hand");
      std::operator<<(poVar2,(string *)Format::NL_abi_cxx11_);
    }
  }
  peVar3 = std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_30);
  std::__cxx11::stringstream::str();
  (**(peVar3->super_Entity)._vptr_Entity)(peVar3,local_340);
  std::__cxx11::string::~string(local_340);
  std::__cxx11::stringstream::~stringstream
            ((stringstream *)&main.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__cxx11::string::~string((string *)local_50);
  std::shared_ptr<Player>::~shared_ptr((shared_ptr<Player> *)local_30);
  return;
}

Assistant:

void PlayingState::CmdUnWield(const std::string &input, std::shared_ptr<Connection> connection,
                              std::shared_ptr<GameData> game_data) {
    auto player = connection->GetPlayer();
    auto match = Utils::FindMatch({"main", "off"}, input);
    std::stringstream ss;
    if(match == "main") {
        auto main = player->GetMainHand();
        if (main != nullptr) {
            player->SetMainHand(nullptr);
            player->AddItem(main);
            ss << "Unwielded " << main->GetItemName() << Format::NL;
        } else {
            ss << "Nothing to unwield" << Format::NL;
        }
    }
    else if(match == "off") {
        auto off = player->GetOffHand();
        if(off != nullptr) {
            player->SetOffHand(nullptr);
            player->AddItem(off);
            ss << "Unwielded " << off->GetItemName() << Format::NL;
        } else {
            ss << "Nothing to unwield" << Format::NL;
        }
    }
    else {
        ss << "Please indicate <main> or <off> hand" << Format::NL;
    }
    player->Send(ss.str());
}